

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

int __thiscall
glcts::TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::init
          (vertexArrayObjectDefinition *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  samplingFunction *in_RCX;
  long in_RDX;
  bufferCollection *in_R8;
  int in_R9D;
  uint local_74;
  uint local_70;
  GLuint i_1;
  GLuint i;
  GLuint n_routine_attributes;
  attributeDefinition *routine_attributes;
  attributeDefinition *paStack_58;
  GLuint n_format_attributes;
  attributeDefinition *format_attributes;
  attributeDefinition positionAttribute;
  GLuint program_id_local;
  bufferCollection *buffers_local;
  samplingFunction *sampling_function_local;
  formatDefinition *format_local;
  Functions *gl_local;
  vertexArrayObjectDefinition *this_local;
  
  this->m_gl = (Functions *)ctx;
  positionAttribute.binding = in_R9D;
  (*this->m_gl->genVertexArrays)(1,&this->m_vertex_array_object_id);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"Failed to generate VAO.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x13d0);
  (*this->m_gl->bindVertexArray)(this->m_vertex_array_object_id);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"Failed to bind VAO.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x13d3);
  format_attributes = (attributeDefinition *)0x2be235e;
  positionAttribute.name = "vec4 ";
  positionAttribute.type = (GLchar *)0x0;
  _i = (attributeDefinition *)0x0;
  i_1 = 0;
  getAttributes(*(samplerType *)(in_RDX + 0x20),&stack0xffffffffffffffa8,
                (GLuint *)((long)&routine_attributes + 4));
  getAttributes(*in_RCX,(attributeDefinition **)&i,&i_1);
  setupAttribute(this,(attributeDefinition *)&format_attributes,in_R8,positionAttribute.binding);
  for (local_70 = 0; local_70 < i_1; local_70 = local_70 + 1) {
    setupAttribute(this,_i + local_70,in_R8,positionAttribute.binding);
  }
  for (local_74 = 0; local_74 < routine_attributes._4_4_; local_74 = local_74 + 1) {
    setupAttribute(this,paStack_58 + local_74,in_R8,positionAttribute.binding);
  }
  return local_74;
}

Assistant:

void TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::init(const glw::Functions&   gl,
																		const formatDefinition& format,
																		const samplingFunction& sampling_function,
																		const bufferCollection& buffers,
																		glw::GLuint				program_id)
{
	m_gl = &gl;

	m_gl->genVertexArrays(1, &m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to generate VAO.");

	m_gl->bindVertexArray(m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to bind VAO.");

	attributeDefinition		   positionAttribute = { vertex_shader_position, type_vec4, Position, 0 };
	const attributeDefinition* format_attributes;
	glw::GLuint				   n_format_attributes;
	const attributeDefinition* routine_attributes   = 0;
	glw::GLuint				   n_routine_attributes = 0;

	getAttributes(format.m_sampler_type, format_attributes, n_format_attributes);
	getAttributes(sampling_function, routine_attributes, n_routine_attributes);

	setupAttribute(positionAttribute, buffers, program_id);

	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		setupAttribute(routine_attributes[i], buffers, program_id);
	}

	for (glw::GLuint i = 0; i < n_format_attributes; ++i)
	{
		setupAttribute(format_attributes[i], buffers, program_id);
	}
}